

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O2

void __thiscall cmDebugServerConsole::OnChangeState(cmDebugServerConsole *this)

{
  bool bVar1;
  int iVar2;
  cmListFileContext currentLine;
  cmPauseContext ctx;
  cmListFileContext local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  cmPauseContext local_e8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar2 = (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[9])();
  if (iVar2 == 0) {
    std::__cxx11::string::string((string *)&local_150,"Unknown state\n",(allocator *)&local_108);
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_150.Name);
    std::__cxx11::string::~string((string *)&local_150);
    printPrompt(this,(cmConnection *)0x0);
  }
  else if (iVar2 == 2) {
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
              (&local_e8);
    bVar1 = cmPauseContext::operator_cast_to_bool(&local_e8);
    if (bVar1) {
      cmPauseContext::CurrentLine(&local_150,&local_e8);
      std::operator+(&local_b0,"Paused at ",&local_150.FilePath);
      std::operator+(&local_90,&local_b0,":");
      std::__cxx11::to_string(&local_d0,local_150.Line);
      std::operator+(&local_70,&local_90,&local_d0);
      std::operator+(&local_50,&local_70," (");
      std::operator+(&local_30,&local_50,&local_150.Name);
      std::operator+(&local_108,&local_30,")\n");
      cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      cmListFileContext::~cmListFileContext(&local_150);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_150,"Paused at indeterminate state\n",(allocator *)&local_108);
      cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_150.Name);
      std::__cxx11::string::~string((string *)&local_150);
    }
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&PROMPT_abi_cxx11_);
    std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&local_e8.Lock);
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::string((string *)&local_150,"Running...\n",(allocator *)&local_108);
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_150.Name);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return;
}

Assistant:

void cmDebugServerConsole::OnChangeState()
{
  cmDebugServer::OnChangeState();

  switch (Debugger.CurrentState()) {
    case cmDebugger::State::Running:
      AsyncBroadcast("Running...\n");
      break;
    case cmDebugger::State::Paused: {
      auto ctx = Debugger.PauseContext();
      if (ctx) {
        auto currentLine = ctx.CurrentLine();
        AsyncBroadcast("Paused at " + currentLine.FilePath + ":" +
                       std::to_string(currentLine.Line) + " (" +
                       currentLine.Name + ")\n");
      } else {
        AsyncBroadcast("Paused at indeterminate state\n");
      }
      AsyncBroadcast(PROMPT);
    } break;
    case cmDebugger::State::Unknown:
      AsyncBroadcast("Unknown state\n");
      printPrompt();
      break;
  }
}